

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fMultisampleTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::SampleStencilCase::iterate(SampleStencilCase *this)

{
  ostringstream *poVar1;
  RGBA c;
  TestLog *log;
  GLenum GVar2;
  int iVar3;
  Surface *pSVar4;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  char *description;
  int __fd;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int i;
  int iVar9;
  int iVar10;
  bool bVar11;
  float fVar12;
  allocator<char> local_26d;
  float local_26c;
  Surface clearedImg;
  Vec2 local_248;
  float local_23c;
  string local_238;
  string local_218;
  float local_1f8;
  Surface renderedImgSecond;
  Surface renderedImgFirst;
  undefined1 local_1b0 [384];
  
  log = ((this->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
        m_log;
  iVar9 = (this->super_MultisampleCase).m_viewportSize;
  tcu::Surface::Surface(&renderedImgFirst,iVar9,iVar9);
  iVar9 = (this->super_MultisampleCase).m_viewportSize;
  tcu::Surface::Surface(&renderedImgSecond,iVar9,iVar9);
  MultisampleCase::randomizeViewport(&this->super_MultisampleCase);
  glwClearColor(0.0,0.0,0.0,1.0);
  GVar2 = glwGetError();
  glu::checkError(GVar2,"glClearColor(0.0f, 0.0f, 0.0f, 1.0f)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                  ,0x473);
  glwClearStencil(0);
  GVar2 = glwGetError();
  glu::checkError(GVar2,"glClearStencil(0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                  ,0x474);
  glwClear(0x4400);
  GVar2 = glwGetError();
  glu::checkError(GVar2,"glClear(GL_COLOR_BUFFER_BIT | GL_STENCIL_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                  ,0x475);
  glwEnable(0xb90);
  GVar2 = glwGetError();
  glu::checkError(GVar2,"glEnable(GL_STENCIL_TEST)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                  ,0x476);
  glwStencilFunc(0x207,1,1);
  GVar2 = glwGetError();
  glu::checkError(GVar2,"glStencilFunc(GL_ALWAYS, 1, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                  ,0x477);
  glwStencilOp(0x1e00,0x1e00,0x1e01);
  GVar2 = glwGetError();
  glu::checkError(GVar2,"glStencilOp(GL_KEEP, GL_KEEP, GL_REPLACE)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                  ,0x478);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,
                  "Drawing a pattern with glStencilFunc(GL_ALWAYS, 1, 1) and glStencilOp(GL_KEEP, GL_KEEP, GL_REPLACE)"
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  for (iVar9 = 0; iVar9 != 0x19; iVar9 = iVar9 + 1) {
    local_23c = ((float)iVar9 * 6.2831855) / 25.0;
    local_26c = (((float)iVar9 + 0.5) * 6.2831855) / 25.0;
    local_218._M_dataplus._M_p = (pointer)0x0;
    local_1f8 = cosf(local_23c);
    fVar12 = sinf(local_23c);
    local_238._M_dataplus._M_p =
         (pointer)CONCAT44(fVar12 * (float)0x3f733333,local_1f8 * (float)0x3f733333);
    local_1f8 = cosf(local_26c);
    fVar12 = sinf(local_26c);
    clearedImg.m_height = (int)(fVar12 * (float)0x3f733333);
    clearedImg.m_width = (int)(local_1f8 * (float)0x3f733333);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_1b0,1.0);
    MultisampleCase::renderTriangle
              (&this->super_MultisampleCase,(Vec2 *)&local_218,(Vec2 *)&local_238,
               (Vec2 *)&clearedImg,(Vector<float,_4> *)local_1b0);
  }
  MultisampleCase::readImage(&this->super_MultisampleCase,&renderedImgFirst);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"RenderedImgFirst",(allocator<char> *)&clearedImg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"First image rendered",(allocator<char> *)&local_248);
  pSVar4 = &renderedImgFirst;
  tcu::LogImage::LogImage
            ((LogImage *)local_1b0,&local_218,&local_238,pSVar4,QP_IMAGE_COMPRESSION_MODE_PNG);
  __fd = (int)log;
  tcu::LogImage::write((LogImage *)local_1b0,__fd,__buf,(size_t)pSVar4);
  tcu::LogImage::~LogImage((LogImage *)local_1b0);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Clearing color buffer to black");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  glwClear(0x4000);
  GVar2 = glwGetError();
  glu::checkError(GVar2,"glClear(GL_COLOR_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                  ,0x48f);
  glwStencilFunc(0x202,1,1);
  GVar2 = glwGetError();
  glu::checkError(GVar2,"glStencilFunc(GL_EQUAL, 1, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                  ,0x490);
  glwStencilOp(0x1e00,0x1e00,0x1e00);
  GVar2 = glwGetError();
  glu::checkError(GVar2,"glStencilOp(GL_KEEP, GL_KEEP, GL_KEEP)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                  ,0x491);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Checking that color buffer was actually cleared to black");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  iVar9 = (this->super_MultisampleCase).m_viewportSize;
  tcu::Surface::Surface(&clearedImg,iVar9,iVar9);
  MultisampleCase::readImage(&this->super_MultisampleCase,&clearedImg);
  iVar9 = 0;
  uVar5 = 0;
  if (0 < clearedImg.m_width) {
    uVar5 = clearedImg._0_8_ & 0xffffffff;
  }
  iVar3 = clearedImg.m_height;
  if (clearedImg.m_height < 1) {
    iVar3 = 0;
  }
  iVar10 = 0;
  do {
    if (iVar10 == iVar3) {
      tcu::Surface::~Surface(&clearedImg);
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,
                      "Drawing a viewport-sized quad with glStencilFunc(GL_EQUAL, 1, 1) and glStencilOp(GL_KEEP, GL_KEEP, GL_KEEP) - should result in same image as the first"
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      local_218._M_dataplus._M_p = (pointer)0xbf800000bf800000;
      local_238._M_dataplus._M_p = (pointer)0xbf8000003f800000;
      clearedImg.m_width = -0x40800000;
      clearedImg.m_height = 0x3f800000;
      local_248.m_data[0] = 1.0;
      local_248.m_data[1] = 1.0;
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_1b0,1.0);
      MultisampleCase::renderQuad
                (&this->super_MultisampleCase,(Vec2 *)&local_218,(Vec2 *)&local_238,
                 (Vec2 *)&clearedImg,&local_248,(Vector<float,_4> *)local_1b0);
      MultisampleCase::readImage(&this->super_MultisampleCase,&renderedImgSecond);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_218,"RenderedImgSecond",(allocator<char> *)&clearedImg);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,"Second image rendered",(allocator<char> *)&local_248);
      pSVar4 = &renderedImgSecond;
      tcu::LogImage::LogImage
                ((LogImage *)local_1b0,&local_218,&local_238,pSVar4,QP_IMAGE_COMPRESSION_MODE_PNG);
      tcu::LogImage::write((LogImage *)local_1b0,__fd,__buf_01,(size_t)pSVar4);
      tcu::LogImage::~LogImage((LogImage *)local_1b0);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_218);
      local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffff00000000;
      bVar11 = tcu::pixelThresholdCompare
                         (log,"ImageCompare","Image comparison",&renderedImgFirst,&renderedImgSecond
                          ,(RGBA *)local_1b0,COMPARE_LOG_ON_ERROR);
      if (bVar11) {
        poVar1 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Success: The two images rendered are identical");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        description = "Passed";
      }
      else {
        description = "Failed";
      }
      tcu::TestContext::setTestResult
                (((this->super_MultisampleCase).super_TestCase.m_context)->m_testCtx,(uint)!bVar11,
                 description);
LAB_010a47fb:
      tcu::Surface::~Surface(&renderedImgSecond);
      tcu::Surface::~Surface(&renderedImgFirst);
      return STOP;
    }
    iVar8 = 1;
    uVar7 = uVar5;
    iVar6 = iVar9;
    while (bVar11 = uVar7 != 0, uVar7 = uVar7 - 1, bVar11) {
      c.m_value = *(deUint32 *)((long)clearedImg.m_pixels.m_ptr + (long)iVar6 * 4);
      iVar8 = iVar8 + -1;
      iVar6 = iVar6 + 1;
      if (c.m_value != 0xff000000) {
        poVar1 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Failure: first non-black pixel, color ");
        tcu::operator<<((ostream *)poVar1,c);
        std::operator<<((ostream *)poVar1,", detected at coordinates (");
        std::ostream::operator<<(poVar1,-iVar8);
        std::operator<<((ostream *)poVar1,", ");
        std::ostream::operator<<(poVar1,iVar10);
        std::operator<<((ostream *)poVar1,")");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_218,"ClearedImg",(allocator<char> *)&local_248);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_238,"Image after clearing, erroneously non-black",&local_26d);
        pSVar4 = &clearedImg;
        tcu::LogImage::LogImage
                  ((LogImage *)local_1b0,&local_218,&local_238,pSVar4,QP_IMAGE_COMPRESSION_MODE_BEST
                  );
        tcu::LogImage::write((LogImage *)local_1b0,__fd,__buf_00,(size_t)pSVar4);
        tcu::LogImage::~LogImage((LogImage *)local_1b0);
        std::__cxx11::string::~string((string *)&local_238);
        std::__cxx11::string::~string((string *)&local_218);
        tcu::TestContext::setTestResult
                  (((this->super_MultisampleCase).super_TestCase.m_context)->m_testCtx,
                   QP_TEST_RESULT_FAIL,"Failed");
        tcu::Surface::~Surface(&clearedImg);
        goto LAB_010a47fb;
      }
    }
    iVar10 = iVar10 + 1;
    iVar9 = iVar9 + clearedImg.m_width;
  } while( true );
}

Assistant:

SampleStencilCase::IterateResult SampleStencilCase::iterate (void)
{
	TestLog&		log					= m_testCtx.getLog();
	tcu::Surface	renderedImgFirst	(m_viewportSize, m_viewportSize);
	tcu::Surface	renderedImgSecond	(m_viewportSize, m_viewportSize);

	randomizeViewport();

	GLU_CHECK_CALL(glClearColor(0.0f, 0.0f, 0.0f, 1.0f));
	GLU_CHECK_CALL(glClearStencil(0));
	GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT | GL_STENCIL_BUFFER_BIT));
	GLU_CHECK_CALL(glEnable(GL_STENCIL_TEST));
	GLU_CHECK_CALL(glStencilFunc(GL_ALWAYS, 1, 1));
	GLU_CHECK_CALL(glStencilOp(GL_KEEP, GL_KEEP, GL_REPLACE));

	log << TestLog::Message << "Drawing a pattern with glStencilFunc(GL_ALWAYS, 1, 1) and glStencilOp(GL_KEEP, GL_KEEP, GL_REPLACE)" << TestLog::EndMessage;

	{
		const int numTriangles = 25;
		for (int i = 0; i < numTriangles; i++)
		{
			float angle0 = 2.0f*DE_PI * (float)i			/ (float)numTriangles;
			float angle1 = 2.0f*DE_PI * ((float)i + 0.5f)	/ (float)numTriangles;

			renderTriangle(Vec2(0.0f, 0.0f),
						   Vec2(deFloatCos(angle0)*0.95f, deFloatSin(angle0)*0.95f),
						   Vec2(deFloatCos(angle1)*0.95f, deFloatSin(angle1)*0.95f),
						   Vec4(1.0f));
		}
	}

	readImage(renderedImgFirst);
	log << TestLog::Image("RenderedImgFirst", "First image rendered", renderedImgFirst, QP_IMAGE_COMPRESSION_MODE_PNG);

	log << TestLog::Message << "Clearing color buffer to black" << TestLog::EndMessage;

	GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT));
	GLU_CHECK_CALL(glStencilFunc(GL_EQUAL, 1, 1));
	GLU_CHECK_CALL(glStencilOp(GL_KEEP, GL_KEEP, GL_KEEP));

	{
		log << TestLog::Message << "Checking that color buffer was actually cleared to black" << TestLog::EndMessage;

		tcu::Surface clearedImg(m_viewportSize, m_viewportSize);
		readImage(clearedImg);

		for (int y = 0; y < clearedImg.getHeight(); y++)
		for (int x = 0; x < clearedImg.getWidth(); x++)
		{
			const tcu::RGBA& clr = clearedImg.getPixel(x, y);
			if (clr != tcu::RGBA::black())
			{
				log << TestLog::Message << "Failure: first non-black pixel, color " << clr << ", detected at coordinates (" << x << ", " << y << ")" << TestLog::EndMessage;
				log << TestLog::Image("ClearedImg", "Image after clearing, erroneously non-black", clearedImg);
				m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Failed");
				return STOP;
			}
		}
	}

	log << TestLog::Message << "Drawing a viewport-sized quad with glStencilFunc(GL_EQUAL, 1, 1) and glStencilOp(GL_KEEP, GL_KEEP, GL_KEEP) - should result in same image as the first" << TestLog::EndMessage;

	renderQuad(Vec2(-1.0f, -1.0f),
			   Vec2( 1.0f, -1.0f),
			   Vec2(-1.0f,  1.0f),
			   Vec2( 1.0f,  1.0f),
			   Vec4(1.0f));

	readImage(renderedImgSecond);
	log << TestLog::Image("RenderedImgSecond", "Second image rendered", renderedImgSecond, QP_IMAGE_COMPRESSION_MODE_PNG);

	bool passed = tcu::pixelThresholdCompare(log,
											 "ImageCompare",
											 "Image comparison",
											 renderedImgFirst,
											 renderedImgSecond,
											 tcu::RGBA(0),
											 tcu::COMPARE_LOG_ON_ERROR);

	if (passed)
		log << TestLog::Message << "Success: The two images rendered are identical" << TestLog::EndMessage;

	m_context.getTestContext().setTestResult(passed ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
											 passed ? "Passed"				: "Failed");

	return STOP;
}